

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

void __thiscall Analyser::analyse_parameter_clause(Analyser *this)

{
  any *__other;
  int iVar1;
  string *psVar2;
  bool bVar3;
  char type;
  optional<Token> next;
  vector<char,_std::allocator<char>_> paramTypes;
  any local_108;
  _Optional_payload_base<Token> local_f8;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  nextToken(&next,this);
  if ((next.super__Optional_base<Token,_false,_false>._M_payload.
       super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
       _M_engaged != true) ||
     (next.super__Optional_base<Token,_false,_false>._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type != LEFT_BRACKET)) {
    psVar2 = (string *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              (local_50,"Missing \'(\'",(allocator<char> *)&local_f8);
    iVar1 = this->_currentLine;
    std::__cxx11::string::string(psVar2,local_50);
    *(long *)(psVar2 + 0x20) = (long)iVar1;
    __cxa_throw(psVar2,&Error::typeinfo,Error::~Error);
  }
  nextToken((optional<Token> *)&local_f8,this);
  std::_Optional_payload_base<Token>::_M_move_assign
            ((_Optional_payload_base<Token> *)&next,&local_f8);
  std::_Optional_payload_base<Token>::_M_reset(&local_f8);
  paramTypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  paramTypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  paramTypes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __other = &next.super__Optional_base<Token,_false,_false>._M_payload.
             super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
             _M_payload._M_value._value;
  bVar3 = next.super__Optional_base<Token,_false,_false>._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_payload._M_value._type == RESERVED_WORD;
  while (((next.super__Optional_base<Token,_false,_false>._M_payload.
           super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
           _M_engaged & 1U) != 0 && (bVar3))) {
    std::any::any(&local_108,__other);
    std::any_cast<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
               &local_108);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_f8,"const");
    std::__cxx11::string::~string((string *)&local_f8);
    std::any::reset(&local_108);
    if (bVar3) {
      type = analyse_type_specifier(this);
      std::vector<char,std::allocator<char>>::emplace_back<char&>
                ((vector<char,std::allocator<char>> *)&paramTypes,&type);
      nextToken((optional<Token> *)&local_f8,this);
      std::_Optional_payload_base<Token>::_M_move_assign
                ((_Optional_payload_base<Token> *)&next,&local_f8);
      std::_Optional_payload_base<Token>::_M_reset(&local_f8);
      if ((next.super__Optional_base<Token,_false,_false>._M_payload.
           super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
           _M_engaged != true) ||
         (next.super__Optional_base<Token,_false,_false>._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_payload._M_value._type != IDENTIFIER)) {
        psVar2 = (string *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_70,"Missing <identifier>",(allocator<char> *)&local_f8);
        iVar1 = this->_currentLine;
        std::__cxx11::string::string(psVar2,local_70);
        *(long *)(psVar2 + 0x20) = (long)iVar1;
        __cxa_throw(psVar2,&Error::typeinfo,Error::~Error);
      }
      std::any::any(&local_108,__other);
      std::any_cast<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                 &local_108);
      addVariable(this,(string *)&local_f8,true);
    }
    else {
      unreadToken(this);
      type = analyse_type_specifier(this);
      std::vector<char,std::allocator<char>>::emplace_back<char&>
                ((vector<char,std::allocator<char>> *)&paramTypes,&type);
      nextToken((optional<Token> *)&local_f8,this);
      std::_Optional_payload_base<Token>::_M_move_assign
                ((_Optional_payload_base<Token> *)&next,&local_f8);
      std::_Optional_payload_base<Token>::_M_reset(&local_f8);
      if ((next.super__Optional_base<Token,_false,_false>._M_payload.
           super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
           _M_engaged != true) ||
         (next.super__Optional_base<Token,_false,_false>._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_payload._M_value._type != IDENTIFIER)) {
        psVar2 = (string *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_90,"Missing <identifier>",(allocator<char> *)&local_f8);
        iVar1 = this->_currentLine;
        std::__cxx11::string::string(psVar2,local_90);
        *(long *)(psVar2 + 0x20) = (long)iVar1;
        __cxa_throw(psVar2,&Error::typeinfo,Error::~Error);
      }
      std::any::any(&local_108,__other);
      std::any_cast<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
                 &local_108);
      addVariable(this,(string *)&local_f8,false);
    }
    std::__cxx11::string::~string((string *)&local_f8);
    std::any::reset(&local_108);
    nextToken((optional<Token> *)&local_f8,this);
    std::_Optional_payload_base<Token>::_M_move_assign
              ((_Optional_payload_base<Token> *)&next,&local_f8);
    std::_Optional_payload_base<Token>::_M_reset(&local_f8);
    if ((next.super__Optional_base<Token,_false,_false>._M_payload.
         super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
         _M_engaged != true) ||
       (next.super__Optional_base<Token,_false,_false>._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type != COMMA_SIGH)) break;
    nextToken((optional<Token> *)&local_f8,this);
    std::_Optional_payload_base<Token>::_M_move_assign
              ((_Optional_payload_base<Token> *)&next,&local_f8);
    std::_Optional_payload_base<Token>::_M_reset(&local_f8);
    if ((next.super__Optional_base<Token,_false,_false>._M_payload.
         super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
         _M_engaged != true) ||
       (bVar3 = true,
       next.super__Optional_base<Token,_false,_false>._M_payload.
       super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
       _M_payload._M_value._type != RESERVED_WORD)) {
      psVar2 = (string *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                (local_b0,"Missing <identifier>",(allocator<char> *)&local_f8);
      iVar1 = this->_currentLine;
      std::__cxx11::string::string(psVar2,local_b0);
      *(long *)(psVar2 + 0x20) = (long)iVar1;
      __cxa_throw(psVar2,&Error::typeinfo,Error::~Error);
    }
  }
  addFunctionParameter(this,&paramTypes);
  if ((next.super__Optional_base<Token,_false,_false>._M_payload.
       super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
       _M_engaged == true) &&
     (next.super__Optional_base<Token,_false,_false>._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type == RIGHT_BRACKET)) {
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&paramTypes.super__Vector_base<char,_std::allocator<char>_>);
    std::_Optional_payload_base<Token>::_M_reset((_Optional_payload_base<Token> *)&next);
    return;
  }
  psVar2 = (string *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,"Missing \')\'",(allocator<char> *)&local_f8);
  iVar1 = this->_currentLine;
  std::__cxx11::string::string(psVar2,local_d0);
  *(long *)(psVar2 + 0x20) = (long)iVar1;
  __cxa_throw(psVar2,&Error::typeinfo,Error::~Error);
}

Assistant:

void Analyser::analyse_parameter_clause() {
	auto next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::LEFT_BRACKET) {
		throw Error("Missing '('", _currentLine);
	}
	//<parameter-declaration>
	next = nextToken();
	std::vector<char> paramTypes;
	while (true) {
		if (!next.has_value() || next.value().GetType() != TokenType::RESERVED_WORD) {
			break;
		}
		//const
		if (std::any_cast<std::string>(next.value().GetValue()) == "const") {
			char type = analyse_type_specifier();
			paramTypes.emplace_back(type);
			//<identifier>
			next = nextToken();
			if (!next.has_value() || (next.value().GetType() != TokenType::IDENTIFIER)) {
				throw Error("Missing <identifier>", _currentLine);
			}
			addVariable(std::any_cast<std::string>(next.value().GetValue()), true);
		}
		//non-const
		else {
			unreadToken();
			char type = analyse_type_specifier();
			paramTypes.emplace_back(type);
			next = nextToken();
			if (!next.has_value() || (next.value().GetType() != TokenType::IDENTIFIER)) {
				throw Error("Missing <identifier>", _currentLine);
			}
			addVariable(std::any_cast<std::string>(next.value().GetValue()), false);
		}
		//','
		next = nextToken();
		if (!next.has_value() || next.value().GetType() != TokenType::COMMA_SIGH) {
			break;
		}
		//Ԥ���ж��Ƿ�Ϊfunc(int a ,)���ִ�������
		next = nextToken();
		if (!next.has_value() || next.value().GetType() != TokenType::RESERVED_WORD) {
			throw Error("Missing <identifier>", _currentLine);
		}
	}
	addFunctionParameter(paramTypes);
	if (!next.has_value() || next.value().GetType() != TokenType::RIGHT_BRACKET) {
		throw Error("Missing ')'", _currentLine);
	}
}